

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O2

double TestSpectra::CH3T_spectrum(double xMin,double xMax)

{
  ostream *poVar1;
  RandomGen *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  initializer_list<double> __l;
  allocator_type local_89;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  vector<double,_std::allocator<double>_> xyTry;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  local_68 = 18.5898;
  if (xMax <= 18.5898) {
    local_68 = xMax;
  }
  local_78 = 0.0;
  if (0.0 <= xMin) {
    local_78 = xMin;
  }
  if ((((local_78 != 0.0) || (NAN(local_78))) || (local_68 != 18.5898)) || (NAN(local_68))) {
    std::operator<<((ostream *)&std::cerr,"WARNING: Recommended energy range is 0 to ");
    poVar1 = std::ostream::_M_insert<double>(18.5898);
    poVar1 = std::operator<<(poVar1," keV");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  local_88 = local_68 - local_78;
  pRVar2 = RandomGen::rndm();
  dVar3 = RandomGen::rand_uniform(pRVar2);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar3 * local_88 + local_78);
  pRVar2 = RandomGen::rndm();
  dVar3 = RandomGen::rand_uniform(pRVar2);
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)(dVar3 * 11000000.0);
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_28;
  std::vector<double,_std::allocator<double>_>::vector(&xyTry,__l,&local_89);
  while (dVar3 = *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
        0.0 < xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2]) {
    dVar3 = dVar3 * dVar3 + (dVar3 + dVar3) * 510.9989461;
    if (dVar3 < 0.0) {
      local_58 = sqrt(dVar3);
    }
    else {
      local_58 = SQRT(dVar3);
    }
    dVar3 = *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88 = (dVar3 + 510.9989461) * 0.09170123685302745;
    uStack_80 = 0;
    dVar4 = dVar3 * dVar3 + (dVar3 + dVar3) * 510.9989461;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = (*xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start +
            *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start) * 510.9989461;
    if (dVar5 < 0.0) {
      local_70 = dVar4;
      local_60 = sqrt(dVar5);
      dVar4 = local_70;
    }
    else {
      local_60 = SQRT(dVar5);
    }
    local_88 = local_88 / dVar4;
    dVar4 = *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70 = exp(-local_88);
    pRVar2 = RandomGen::rndm();
    dVar5 = 18.5898 - dVar4;
    RandomGen::VonNeumann
              ((vector<double,_std::allocator<double>_> *)&local_28,pRVar2,local_78,local_68,0.0,
               11000000.0,
               *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
               xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               ((local_58 / (dVar3 + 510.9989461)) * -0.001427 + 1.002037) *
               (1.0 / (1.0 - local_70)) *
               local_88 * local_60 * (dVar4 + 510.9989461) * dVar5 * dVar5);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&xyTry,&local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  }
  local_88 = dVar3;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xyTry.super__Vector_base<double,_std::allocator<double>_>);
  return local_88;
}

Assistant:

double TestSpectra::CH3T_spectrum(double xMin, double xMax) {
  double m_e = ElectronRestMassEnergy;  // e- rest mass-energy [keV]
  double aa = 0.0072973525664;          // fine structure constant
  double ZZ = 2.;
  double qValue = 18.5898;  // tritium beta decay endpoint [keV]

  if (xMax > qValue) xMax = qValue;
  if (xMin < 0.) xMin = 0.;
  if (xMin != 0. || xMax != qValue)
    cerr << "WARNING: Recommended energy range is 0 to " << qValue << " keV"
         << endl;
  double yMax = 1.1e7;  // top of the beta decay E histogram
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double B =
        sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e) / (xyTry[0] + m_e);
    double x = (2. * M_PI * ZZ * aa) * (xyTry[0] + m_e) /
               sqrt(xyTry[0] * xyTry[0] + 2. * xyTry[0] * m_e);
    double FuncValue = (sqrt(2. * xyTry[0] * m_e) * (xyTry[0] + m_e) *
                        (qValue - xyTry[0]) * (qValue - xyTry[0]) * x *
                        (1. / (1. - exp(-x))) * (1.002037 - 0.001427 * (B)));
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}